

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# standard_buffer_manager.cpp
# Opt level: O1

void __thiscall
duckdb::StandardBufferManager::ReAllocate
          (StandardBufferManager *this,shared_ptr<duckdb::BlockHandle,_true> *handle,
          idx_t block_size)

{
  MemoryTag tag;
  StringUtil *this_00;
  BlockHandle *pBVar1;
  unique_ptr<duckdb::FileBuffer,_std::default_delete<duckdb::FileBuffer>,_true> *this_01;
  pointer this_02;
  idx_t block_header_size;
  StringUtil *this_03;
  long lVar2;
  long lVar3;
  unsigned_long memory_delta;
  idx_t in_RCX;
  MemoryRequirement MVar4;
  BlockLock lock;
  TempBufferPoolReservation reservation;
  BufferPoolReservation local_88;
  string local_70;
  string local_50;
  
  pBVar1 = shared_ptr<duckdb::BlockHandle,_true>::operator->(handle);
  lock._M_device = &pBVar1->lock;
  lock._M_owns = false;
  ::std::unique_lock<std::mutex>::lock(&lock);
  lock._M_owns = true;
  pBVar1 = shared_ptr<duckdb::BlockHandle,_true>::operator->(handle);
  this_00 = (StringUtil *)(pBVar1->memory_usage).super___atomic_base<unsigned_long>._M_i;
  pBVar1 = shared_ptr<duckdb::BlockHandle,_true>::operator->(handle);
  this_01 = BlockHandle::GetBuffer(pBVar1,&lock);
  this_02 = unique_ptr<duckdb::FileBuffer,_std::default_delete<duckdb::FileBuffer>,_true>::
            operator->(this_01);
  pBVar1 = shared_ptr<duckdb::BlockHandle,_true>::operator->(handle);
  if ((pBVar1->block_manager->block_header_size).index == 0xffffffffffffffff) {
    block_header_size = 8;
  }
  else {
    block_header_size = optional_idx::GetIndex(&pBVar1->block_manager->block_header_size);
  }
  MVar4 = FileBuffer::CalculateMemory(this_02,block_size,block_header_size);
  this_03 = (StringUtil *)MVar4.alloc_size;
  lVar2 = NumericCastImpl<long,_unsigned_long,_false>::Convert((unsigned_long)this_03);
  lVar3 = NumericCastImpl<long,_unsigned_long,_false>::Convert((unsigned_long)this_00);
  lVar2 = lVar2 - lVar3;
  if (lVar2 != 0) {
    if (lVar2 < 1) {
      pBVar1 = shared_ptr<duckdb::BlockHandle,_true>::operator->(handle);
      BlockHandle::ResizeMemory(pBVar1,&lock,(idx_t)this_03);
    }
    else {
      ::std::unique_lock<std::mutex>::unlock(&lock);
      pBVar1 = shared_ptr<duckdb::BlockHandle,_true>::operator->(handle);
      tag = pBVar1->tag;
      memory_delta = NumericCastImpl<unsigned_long,_long,_false>::Convert(lVar2);
      StringUtil::BytesToHumanReadableString_abi_cxx11_(&local_70,this_00,0x400,in_RCX);
      StringUtil::BytesToHumanReadableString_abi_cxx11_(&local_50,this_03,0x400,in_RCX);
      EvictBlocksOrThrow<char_const*,std::__cxx11::string,std::__cxx11::string>
                (&reservation,this,tag,memory_delta,
                 (unique_ptr<duckdb::FileBuffer,_std::default_delete<duckdb::FileBuffer>,_true> *)
                 0x0,"failed to resize block from %s to %s%s",
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_70,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_50);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_50._M_dataplus._M_p != &local_50.field_2) {
        operator_delete(local_50._M_dataplus._M_p);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_70._M_dataplus._M_p != &local_70.field_2) {
        operator_delete(local_70._M_dataplus._M_p);
      }
      ::std::unique_lock<std::mutex>::lock(&lock);
      pBVar1 = shared_ptr<duckdb::BlockHandle,_true>::operator->(handle);
      BufferPoolReservation::BufferPoolReservation
                (&local_88,&reservation.super_BufferPoolReservation);
      BlockHandle::MergeMemoryReservation(pBVar1,&lock,&local_88);
      BufferPoolReservation::~BufferPoolReservation(&local_88);
      TempBufferPoolReservation::~TempBufferPoolReservation(&reservation);
    }
    pBVar1 = shared_ptr<duckdb::BlockHandle,_true>::operator->(handle);
    BlockHandle::ResizeBuffer(pBVar1,&lock,block_size,lVar2);
  }
  ::std::unique_lock<std::mutex>::~unique_lock(&lock);
  return;
}

Assistant:

void StandardBufferManager::ReAllocate(shared_ptr<BlockHandle> &handle, idx_t block_size) {
	//! is this function ever used?
	D_ASSERT(block_size >= GetBlockSize());
	auto lock = handle->GetLock();

	auto handle_memory_usage = handle->GetMemoryUsage();
	D_ASSERT(handle->GetState() == BlockState::BLOCK_LOADED);
	D_ASSERT(handle_memory_usage == handle->GetBuffer(lock)->AllocSize());
	D_ASSERT(handle_memory_usage == handle->GetMemoryCharge(lock).size);

	auto req = handle->GetBuffer(lock)->CalculateMemory(block_size, handle->block_manager.GetBlockHeaderSize());
	int64_t memory_delta = NumericCast<int64_t>(req.alloc_size) - NumericCast<int64_t>(handle_memory_usage);

	if (memory_delta == 0) {
		return;
	} else if (memory_delta > 0) {
		// evict blocks until we have space to resize this block
		// unlock the handle lock during the call to EvictBlocksOrThrow
		lock.unlock();
		auto reservation = EvictBlocksOrThrow(handle->GetMemoryTag(), NumericCast<idx_t>(memory_delta), nullptr,
		                                      "failed to resize block from %s to %s%s",
		                                      StringUtil::BytesToHumanReadableString(handle_memory_usage),
		                                      StringUtil::BytesToHumanReadableString(req.alloc_size));
		lock.lock();

		// EvictBlocks decrements 'current_memory' for us.
		handle->MergeMemoryReservation(lock, std::move(reservation));
	} else {
		// no need to evict blocks, but we do need to decrement 'current_memory'.
		handle->ResizeMemory(lock, req.alloc_size);
	}

	handle->ResizeBuffer(lock, block_size, memory_delta);
}